

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool __thiscall ImGuiTextFilter::PassFilter(ImGuiTextFilter *this,char *text,char *text_end)

{
  char cVar1;
  ImGuiTextRange *pIVar2;
  char *needle_end;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  char *haystack;
  bool bVar6;
  
  uVar4 = (ulong)(uint)(this->Filters).Size;
  if (uVar4 == 0) {
    bVar6 = true;
  }
  else {
    haystack = "";
    if (text != (char *)0x0) {
      haystack = text;
    }
    pIVar2 = (this->Filters).Data;
    for (lVar5 = 0; uVar4 << 4 != lVar5; lVar5 = lVar5 + 0x10) {
      pcVar3 = *(char **)((long)&pIVar2->b + lVar5);
      needle_end = *(char **)((long)&pIVar2->e + lVar5);
      if (pcVar3 != needle_end) {
        cVar1 = *pcVar3;
        if (cVar1 == '-') {
          pcVar3 = pcVar3 + 1;
        }
        pcVar3 = ImStristr(haystack,text_end,pcVar3,needle_end);
        if (pcVar3 != (char *)0x0) {
          return cVar1 != '-';
        }
      }
    }
    bVar6 = this->CountGrep == 0;
  }
  return bVar6;
}

Assistant:

const char* ImStristr(const char* haystack, const char* haystack_end, const char* needle, const char* needle_end)
{
    if (!needle_end)
        needle_end = needle + strlen(needle);

    const char un0 = (char)toupper(*needle);
    while ((!haystack_end && *haystack) || (haystack_end && haystack < haystack_end))
    {
        if (toupper(*haystack) == un0)
        {
            const char* b = needle + 1;
            for (const char* a = haystack + 1; b < needle_end; a++, b++)
                if (toupper(*a) != toupper(*b))
                    break;
            if (b == needle_end)
                return haystack;
        }
        haystack++;
    }
    return NULL;
}